

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerHLSL::image_type_hlsl_legacy_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *type,uint32_t param_2)

{
  Dim DVar1;
  long lVar2;
  SPIRType *pSVar3;
  long *plVar4;
  runtime_error *this_00;
  char *pcVar5;
  size_type *psVar6;
  string res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  _Alloc_hider local_60;
  size_type local_58;
  char local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pSVar3 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + (type->image).type.id);
  local_58 = 0;
  local_50 = '\0';
  local_60._M_p = &local_50;
  if (pSVar3->basetype == UInt) {
    pcVar5 = "u";
  }
  else {
    if (pSVar3->basetype != Int) goto LAB_001a8638;
    pcVar5 = "i";
  }
  ::std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)0x0,(ulong)pcVar5);
LAB_001a8638:
  if ((type->image).dim == DimSubpassData && type->basetype == Image) {
    local_40[0] = local_30;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,local_60._M_p,local_60._M_p + local_58);
    ::std::__cxx11::string::append((char *)local_40);
    plVar4 = (long *)::std::__cxx11::string::append((char *)local_40);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  else {
    ::std::__cxx11::string::append((char *)&local_60);
    DVar1 = (type->image).dim;
    if ((DimSubpassData < DVar1) || ((0x6fU >> (DVar1 & 0x1f) & 1) == 0)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_00,"Only 1D, 2D, 3D, Buffer, InputTarget and Cube textures supported.");
      *(undefined ***)this_00 = &PTR__runtime_error_0035fca8;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::append((char *)&local_60);
    if ((type->image).ms == true) {
      ::std::__cxx11::string::append((char *)&local_60);
    }
    if ((type->image).arrayed == true) {
      ::std::__cxx11::string::append((char *)&local_60);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_60._M_p == &local_50) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_48;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_60._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
    }
    __return_storage_ptr__->_M_string_length = local_58;
    local_58 = 0;
    local_50 = '\0';
    local_60._M_p = &local_50;
  }
  if (local_60._M_p != &local_50) {
    operator_delete(local_60._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::image_type_hlsl_legacy(const SPIRType &type, uint32_t /*id*/)
{
	auto &imagetype = get<SPIRType>(type.image.type);
	string res;

	switch (imagetype.basetype)
	{
	case SPIRType::Int:
		res = "i";
		break;
	case SPIRType::UInt:
		res = "u";
		break;
	default:
		break;
	}

	if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData)
		return res + "subpassInput" + (type.image.ms ? "MS" : "");

	// If we're emulating subpassInput with samplers, force sampler2D
	// so we don't have to specify format.
	if (type.basetype == SPIRType::Image && type.image.dim != DimSubpassData)
	{
		// Sampler buffers are always declared as samplerBuffer even though they might be separate images in the SPIR-V.
		if (type.image.dim == DimBuffer && type.image.sampled == 1)
			res += "sampler";
		else
			res += type.image.sampled == 2 ? "image" : "texture";
	}
	else
		res += "sampler";

	switch (type.image.dim)
	{
	case Dim1D:
		res += "1D";
		break;
	case Dim2D:
		res += "2D";
		break;
	case Dim3D:
		res += "3D";
		break;
	case DimCube:
		res += "CUBE";
		break;

	case DimBuffer:
		res += "Buffer";
		break;

	case DimSubpassData:
		res += "2D";
		break;
	default:
		SPIRV_CROSS_THROW("Only 1D, 2D, 3D, Buffer, InputTarget and Cube textures supported.");
	}

	if (type.image.ms)
		res += "MS";
	if (type.image.arrayed)
		res += "Array";

	return res;
}